

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O2

int __thiscall CrailDirectory::Enumerate(CrailDirectory *this)

{
  undefined8 this_00;
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  shared_ptr<crail::ByteBuffer> buf;
  DirectoryRecord record;
  undefined1 local_90 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Future<int> local_78;
  DirectoryRecord local_58;
  __shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  uVar4 = (this->super_CrailNode).file_info_.capacity_;
  local_78.super_AsyncTask<int>._vptr_AsyncTask._0_4_ = 0;
  std::
  make_unique<CrailInputstream,std::shared_ptr<NamenodeClient>&,std::shared_ptr<StorageCache>&,std::shared_ptr<BlockCache>&,FileInfo&,int>
            ((shared_ptr<NamenodeClient> *)local_90,
             (shared_ptr<StorageCache> *)&(this->super_CrailNode).namenode_client_,
             (shared_ptr<BlockCache> *)&(this->super_CrailNode).storage_cache_,
             (FileInfo *)&(this->super_CrailNode).block_cache_,
             (int *)&(this->super_CrailNode).file_info_);
  local_78.super_AsyncTask<int>._vptr_AsyncTask._0_4_ = 0x200;
  std::make_shared<crail::ByteBuffer,int>((int *)(local_90 + 8));
  DirectoryRecord::DirectoryRecord(&local_58);
  uVar4 = uVar4 >> 9;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = uVar4 & 0xffffffff;
  }
  while (this_00 = local_90._0_8_, iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    *(int *)(local_90._8_8_ + 0xc) = 0;
    *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_90._8_8_ + 0x10))->
             _vptr__Sp_counted_base = *(int *)(local_90._8_8_ + 8);
    std::__shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    CrailInputstream::Read
              (&local_78,(CrailInputstream *)this_00,(shared_ptr<crail::ByteBuffer> *)&local_40);
    if ((local_78.is_done_ == false) &&
       (local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      local_78.result_ =
           (**(local_78.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_AsyncTask)();
      local_78.is_done_ = true;
    }
    Future<int>::~Future(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_90._8_8_ + 0x10))->
             _vptr__Sp_counted_base = *(int *)(local_90._8_8_ + 0xc);
    *(int *)(local_90._8_8_ + 0xc) = 0;
    DirectoryRecord::Update(&local_58,(ByteBuffer *)local_90._8_8_);
    if (local_58.valid_ != 0) {
      std::string::string(&local_78,
                          (string *)
                          local_58.name_._M_t.
                          super___uniq_ptr_impl<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      poVar1 = std::operator<<((ostream *)&std::cout,
                               (char *)CONCAT44(local_78.super_AsyncTask<int>._vptr_AsyncTask._4_4_,
                                                local_78.super_AsyncTask<int>._vptr_AsyncTask._0_4_)
                              );
      std::endl<char,std::char_traits<char>>(poVar1);
      std::string::~string(&local_78);
    }
  }
  DirectoryRecord::~DirectoryRecord(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  if ((CrailInputstream *)local_90._0_8_ != (CrailInputstream *)0x0) {
    (*(*(_func_int ***)local_90._0_8_)[1])();
  }
  return 0;
}

Assistant:

int CrailDirectory::Enumerate() {
  int records = file_info_.capacity() / 512;
  unique_ptr<CrailInputstream> input_stream = make_unique<CrailInputstream>(
      namenode_client_, storage_cache_, block_cache_, file_info_, 0);
  shared_ptr<ByteBuffer> buf = make_shared<ByteBuffer>(512);
  DirectoryRecord record;
  for (int i = 0; i < records; i++) {
    buf->Clear();
    input_stream->Read(buf).get();
    buf->Flip();
    record.Update(*buf);
    if (record.valid()) {
      cout << record.name().c_str() << endl;
    }
  }

  return 0;
}